

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<int,double>
          (ChArchiveOut *this,
          ChNameValue<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
          *bVal)

{
  __node_base *p_Var1;
  long lVar2;
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  specVal;
  char buffer [20];
  ChNameValue<std::pair<int,_double>_> local_a8;
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  local_90;
  pair<int,_double> local_58;
  char local_48 [24];
  
  ChValueSpecific<std::unordered_map<int,_double,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_double>_>_>_>
  ::ChValueSpecific(&local_90,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_90,(bVal->_value->_M_h)._M_element_count);
  lVar2 = 0;
  p_Var1 = &(bVal->_value->_M_h)._M_before_begin;
  while (p_Var1 = p_Var1->_M_nxt, p_Var1 != (__node_base *)0x0) {
    sprintf(local_48,"%lu",lVar2);
    local_a8._value = &local_58;
    local_a8._flags = '\0';
    local_a8._name = local_48;
    out<int,double>(this,&local_a8);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])
              (this,&local_90,(bVal->_value->_M_h)._M_element_count);
    lVar2 = lVar2 + 1;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])
            (this,&local_90,(bVal->_value->_M_h)._M_element_count);
  ChValue::~ChValue(&local_90.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue< std::unordered_map<T, Tv> > bVal) {
          ChValueSpecific< std::unordered_map<T, Tv> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre(specVal, bVal.value().size());
          int i=0;
          for ( auto it = bVal.value().begin(); it != bVal.value().end(); ++it )
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< std::pair<T, Tv> > array_key(buffer, (*it));
              this->out (array_key);
              this->out_array_between(specVal, bVal.value().size());
              ++i;
          }
          this->out_array_end(specVal, bVal.value().size());
      }